

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O2

ssize_t __thiscall
libtorrent::aux::posix_storage::write(posix_storage *this,int __fd,void *__buf,size_t __n)

{
  pointer psVar1;
  FILE *__s;
  bool bVar2;
  undefined1 uVar3;
  open_mode_t mode;
  file_index_t fVar4;
  int iVar5;
  int64_t iVar6;
  void *__buf_00;
  ssize_t sVar7;
  int *piVar8;
  generic_error_category *cat;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  file_storage *pfVar12;
  int in_R8D;
  int in_R9D;
  file_storage *this_00;
  int iVar13;
  long lVar14;
  peer_request pVar15;
  error_code *in_stack_00000008;
  storage_error *local_78;
  uint local_6c;
  error_code e;
  
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  lVar14 = (long)in_R9D + (long)this_00->m_piece_length * (long)in_R8D;
  mode.m_val = (uint)file_storage::file_index_at_offset(this_00,lVar14);
  iVar6 = file_storage::file_offset(this_00,(file_index_t)mode.m_val);
  local_78 = (storage_error *)(lVar14 - iVar6);
  local_6c = 0;
  do {
    if ((long)__n < 1) {
LAB_0026b422:
      return (ulong)local_6c;
    }
    iVar13 = (int)__n;
    iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
    sVar11 = __n;
    if (iVar6 < (long)&(local_78->ec).val_ + (long)iVar13) {
      iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      uVar9 = (int)iVar6 - (int)local_78;
      sVar11 = (size_t)uVar9;
      if ((int)uVar9 < 1) {
        sVar11 = 0;
      }
    }
    iVar10 = (int)sVar11;
    if (iVar10 == 0) {
      do {
        mode.m_val = mode.m_val + 1;
        fVar4 = file_storage::end_file(this_00);
        if (fVar4.m_val <= (int)mode.m_val) goto LAB_0026b422;
        iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      } while (iVar6 == 0);
      iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
      iVar10 = iVar13;
      if (iVar6 < iVar13) {
        iVar6 = file_storage::file_size(this_00,(file_index_t)mode.m_val);
        iVar10 = (int)iVar6;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
      }
      local_78 = (storage_error *)0x0;
    }
    pfVar12 = (this->m_mapped_files)._M_t.
              super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
              .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
    if (pfVar12 == (file_storage *)0x0) {
      pfVar12 = this->m_files;
    }
    bVar2 = file_storage::pad_file_at(pfVar12,(file_index_t)mode.m_val);
    iVar13 = iVar10;
    if (!bVar2) {
      __buf_00 = (void *)(long)iVar10;
      psVar1 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((int)mode.m_val <
            *(int *)&(this->m_file_priority).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
          (psVar1[(int)mode.m_val].m_val == '\0')) &&
         (bVar2 = use_partfile(this,(file_index_t)mode.m_val), bVar2)) {
        e.val_ = 0;
        e._4_4_ = e._4_4_ & 0xffffff00;
        e.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
        pfVar12 = (this->m_mapped_files)._M_t.
                  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
        if (pfVar12 == (file_storage *)0x0) {
          pfVar12 = this->m_files;
        }
        pVar15 = file_storage::map_file(pfVar12,(file_index_t)mode.m_val,(int64_t)local_78,0);
        sVar7 = posix_part_file::write
                          ((this->m_part_file)._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
                           .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>.
                           _M_head_impl,(int)__buf,__buf_00,(ulong)(uint)pVar15.piece.m_val.m_val);
        iVar13 = (int)sVar7;
        if (e.failed_ == true) {
          in_stack_00000008->val_ = e.val_;
          in_stack_00000008->failed_ = (bool)e.failed_;
          *(int3 *)&in_stack_00000008->field_0x5 = e._5_3_;
          in_stack_00000008->cat_ = e.cat_;
          *(undefined1 *)((long)&in_stack_00000008[1].val_ + 3) = 0x25;
        }
      }
      else {
        open_file((posix_storage *)&e,(file_index_t)(int)this,mode,1,local_78);
        iVar13 = -1;
        if (in_stack_00000008->failed_ == false) {
          *(undefined1 *)((long)&in_stack_00000008[1].val_ + 3) = 7;
          __s = (FILE *)CONCAT44(e._4_4_,e.val_);
          sVar11 = fwrite(__buf,1,(size_t)__buf_00,__s);
          iVar13 = (int)sVar11;
          if ((void *)(long)iVar13 != __buf_00) {
            iVar5 = ferror(__s);
            if (iVar5 == 0) {
              cat = (generic_error_category *)libtorrent_category();
              iVar5 = 0x17;
            }
            else {
              piVar8 = __errno_location();
              iVar5 = *piVar8;
              cat = &boost::system::detail::cat_holder<void>::generic_category_instance;
            }
            boost::system::error_code::assign(in_stack_00000008,iVar5,&cat->super_error_category);
          }
          stat_cache::set_dirty(&this->m_stat_cache,(file_index_t)mode.m_val);
        }
        file_pointer::~file_pointer((file_pointer *)&e);
      }
    }
    uVar3 = (undefined1)(mode.m_val >> 0x10);
    if (in_stack_00000008->val_ != 0) {
      *(short *)&in_stack_00000008[1].val_ = (short)mode.m_val;
      *(undefined1 *)((long)&in_stack_00000008[1].val_ + 2) = uVar3;
      goto LAB_0026b422;
    }
    lVar14 = (long)iVar13;
    __buf = (void *)((long)__buf + lVar14);
    __n = __n - lVar14;
    local_78 = (storage_error *)((long)&(local_78->ec).val_ + lVar14);
    local_6c = local_6c + iVar13;
    if ((0 < iVar10) && (iVar13 == 0)) {
      *(undefined1 *)((long)&in_stack_00000008[1].val_ + 3) = 8;
      boost::system::error_code::operator=(in_stack_00000008,eof);
      *(undefined1 *)((long)&in_stack_00000008[1].val_ + 2) = uVar3;
      *(short *)&in_stack_00000008[1].val_ = (short)mode.m_val;
    }
  } while( true );
}

Assistant:

int posix_storage::write(settings_interface const&
		, span<char const> buffer
		, piece_index_t const piece, int const offset
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_WRITE
		std::this_thread::sleep_for(milliseconds(rand() % 800));
#endif
		return readwrite(files(), buffer, piece, offset, error
			, [this](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
			{
				// writing to a pad-file is a no-op
				return int(buf.size());
			}

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				TORRENT_ASSERT(m_part_file);

				error_code e;
				peer_request map = files().map_file(file_index
					, file_offset, 0);
				int const ret = m_part_file->write(buf, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_write;
				}
				return ret;
			}

			file_pointer const f = open_file(file_index, open_mode::write
				, file_offset, ec);
			if (ec.ec) return -1;

			// set this unconditionally in case the upper layer would like to treat
			// short reads as errors
			ec.operation = operation_t::file_write;

			int ret = 0;
			auto const r = static_cast<int>(std::fwrite(buf.data(), 1
				, static_cast<std::size_t>(buf.size()), f.file()));
			if (r != buf.size())
			{
				if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
				else ec.ec.assign(errors::file_too_short, libtorrent_category());
			}
			ret += r;

			// invalidate our stat cache for this file, since
			// we're writing to it
			m_stat_cache.set_dirty(file_index);
			return ret;
		});
	}